

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::sendWebSocketError(Connection *this,StringPtr errorMessage)

{
  PromiseArenaMember *node;
  undefined8 uVar1;
  HttpServerErrorHandler HVar2;
  AsyncInputStream *in_RCX;
  char *pcVar3;
  StringPtr *in_R8;
  Exception exception;
  undefined1 local_210 [16];
  HttpServerErrorHandler HStack_200;
  HttpServer *local_1f8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  Iface *pIStack_1e0;
  HttpInputStream local_1d8;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> WStack_1d0;
  AsyncInputStream *pAStack_1c8;
  char *pcStack_1c0;
  size_t sStack_1b8;
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> local_1b0;
  AsyncInputStream *pAStack_1a8;
  Exception local_1a0;
  
  local_1b0.ptr =
       (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)errorMessage.content.size_;
  pcVar3 = errorMessage.content.ptr;
  pAStack_1a8 = in_RCX;
  kj::_::Debug::makeDescription<char_const(&)[33],kj::StringPtr&>
            ((String *)(local_210 + 8),(Debug *)"\"received bad WebSocket handshake\", errorMessage"
             ,"received bad WebSocket handshake",(char (*) [33])&local_1b0,in_R8);
  Exception::Exception
            (&local_1a0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f7f,(String *)(local_210 + 8));
  HVar2._vptr_HttpServerErrorHandler = HStack_200._vptr_HttpServerErrorHandler;
  uVar1 = local_210._8_8_;
  if ((_func_int **)local_210._8_8_ != (_func_int **)0x0) {
    local_210._8_8_ = (_func_int **)0x0;
    HStack_200._vptr_HttpServerErrorHandler = (_func_int **)0x0;
    (**(local_1f8->super_ErrorHandler)._vptr_ErrorHandler)
              (local_1f8,uVar1,1,HVar2._vptr_HttpServerErrorHandler,
               HVar2._vptr_HttpServerErrorHandler,0);
  }
  local_1e8 = 400;
  pIStack_1e0 = (Iface *)0x4fb375;
  local_1d8._vptr_HttpInputStream = (_func_int **)&DAT_0000000c;
  WStack_1d0.currentWrapper.ptr =
       (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
       (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)local_1b0.ptr;
  pAStack_1c8 = pAStack_1a8;
  pcStack_1c0 = (char *)0x0;
  sStack_1b8 = 0;
  sendError((Connection *)local_210,
            (ProtocolError)
            ZEXT4056(CONCAT832(pAStack_1a8,
                               CONCAT824(local_1b0.ptr,
                                         CONCAT816(0xc,CONCAT88("Bad Request",
                                                                CONCAT44(uStack_1e4,400)))))));
  if (pcVar3[0x168] == '\x01') {
    pcVar3[0x168] = '\0';
    node = *(PromiseArenaMember **)(pcVar3 + 0x170);
    if (node != (PromiseArenaMember *)0x0) {
      pcVar3[0x170] = '\0';
      pcVar3[0x171] = '\0';
      pcVar3[0x172] = '\0';
      pcVar3[0x173] = '\0';
      pcVar3[0x174] = '\0';
      pcVar3[0x175] = '\0';
      pcVar3[0x176] = '\0';
      pcVar3[0x177] = '\0';
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  *(undefined8 *)(pcVar3 + 0x170) = local_210._0_8_;
  local_210._0_8_ = (_func_int **)0x0;
  pcVar3[0x168] = '\x01';
  throwFatalException(&local_1a0,0);
}

Assistant:

kj::Own<WebSocket> sendWebSocketError(StringPtr errorMessage) {
    // The client committed a protocol error during a WebSocket handshake. We will send an error
    // response back to them, and throw an exception from `acceptWebSocket()` to our app. We'll
    // label this as a DISCONNECTED exception, as if the client had simply closed the connection
    // rather than committing a protocol error. This is intended to let the server know that it
    // wasn't an error on the server's part. (This is a big of a hack...)
    kj::Exception exception = KJ_EXCEPTION(DISCONNECTED,
        "received bad WebSocket handshake", errorMessage);
    webSocketError = sendError(
        HttpHeaders::ProtocolError { 400, "Bad Request", errorMessage, nullptr });
    kj::throwFatalException(kj::mv(exception));
  }